

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int cram_uncompress_block(cram_block *b)

{
  uint uVar1;
  size_t sVar2;
  uchar *puVar3;
  cram_block_method cVar4;
  uint usize2;
  size_t uncomp_size;
  uint local_34;
  size_t local_30;
  
  local_30 = 0;
  uVar1 = b->uncomp_size;
  if (uVar1 == 0) {
LAB_00127653:
    b->method = RAW;
LAB_00127695:
    cVar4 = RAW;
  }
  else {
    cVar4 = b->method;
    switch(cVar4) {
    case RAW:
      goto switchD_00127611_caseD_0;
    case GZIP:
      puVar3 = (uchar *)zlib_mem_inflate((char *)b->data,(long)b->comp_size,&local_30);
      sVar2 = local_30;
      if (puVar3 == (uchar *)0x0) {
        return -1;
      }
      if (b->uncomp_size != (int)local_30) {
        free(puVar3);
        return -1;
      }
      free(b->data);
      b->data = puVar3;
      b->alloc = sVar2;
      goto LAB_00127653;
    case BZIP2:
      cram_uncompress_block_cold_2();
      break;
    case LZMA:
      cram_uncompress_block_cold_1();
      break;
    case RANS:
      puVar3 = rans_uncompress(b->data,b->comp_size,&local_34);
      if (uVar1 != local_34) {
        __assert_fail("usize == usize2",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                      ,0x3cb,"int cram_uncompress_block(cram_block *)");
      }
      free(b->data);
      b->data = puVar3;
      b->alloc = (ulong)local_34;
      b->method = RAW;
      b->uncomp_size = local_34;
      goto LAB_00127695;
    }
    cVar4 = ERROR;
  }
switchD_00127611_caseD_0:
  return cVar4;
}

Assistant:

int cram_uncompress_block(cram_block *b) {
    char *uncomp;
    size_t uncomp_size = 0;

    if (b->uncomp_size == 0) {
	// blank block
	b->method = RAW;
	return 0;
    }

    switch (b->method) {
    case RAW:
	return 0;

    case GZIP:
	uncomp = zlib_mem_inflate((char *)b->data, b->comp_size, &uncomp_size);
	if (!uncomp)
	    return -1;
	if ((int)uncomp_size != b->uncomp_size) {
	    free(uncomp);
	    return -1;
	}
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = uncomp_size;
	b->method = RAW;
	break;

#ifdef HAVE_LIBBZ2
    case BZIP2: {
	unsigned int usize = b->uncomp_size;
	if (!(uncomp = malloc(usize)))
	    return -1;
	if (BZ_OK != BZ2_bzBuffToBuffDecompress(uncomp, &usize,
						(char *)b->data, b->comp_size,
						0, 0)) {
	    free(uncomp);
	    return -1;
	}
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = usize;
	b->method = RAW;
	b->uncomp_size = usize; // Just incase it differs
	break;
    }
#else
    case BZIP2:
	fprintf(stderr, "Bzip2 compression is not compiled into this "
		"version.\nPlease rebuild and try again.\n");
	return -1;
#endif

#ifdef HAVE_LIBLZMA
    case LZMA:
	uncomp = lzma_mem_inflate((char *)b->data, b->comp_size, &uncomp_size);
	if (!uncomp)
	    return -1;
	if ((int)uncomp_size != b->uncomp_size)
	    return -1;
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = uncomp_size;
	b->method = RAW;
	break;
#else
    case LZMA:
	fprintf(stderr, "Lzma compression is not compiled into this "
		"version.\nPlease rebuild and try again.\n");
	return -1;
	break;
#endif

    case RANS: {
	unsigned int usize = b->uncomp_size, usize2;
	uncomp = (char *)rans_uncompress(b->data, b->comp_size, &usize2);
	assert(usize == usize2);
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = usize2;
	b->method = RAW;
	b->uncomp_size = usize2; // Just incase it differs
	//fprintf(stderr, "Expanded %d to %d\n", b->comp_size, b->uncomp_size);
	break;
    }

    default:
	return -1;
    }

    return 0;
}